

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O0

void Pdr_ManSetPropertyOutput(Pdr_Man_t *p,int k)

{
  int iVar1;
  void *pvVar2;
  int local_34;
  int i;
  int RetValue;
  int Lit;
  Aig_Obj_t *pObj;
  sat_solver *pSat;
  Pdr_Man_t *pPStack_10;
  int k_local;
  Pdr_Man_t *p_local;
  
  pSat._4_4_ = k;
  pPStack_10 = p;
  pObj = (Aig_Obj_t *)Pdr_ManSolver(p,k);
  local_34 = 0;
  do {
    iVar1 = Saig_ManPoNum(pPStack_10->pAig);
    if (iVar1 <= local_34) {
      sat_solver_compress((sat_solver *)pObj);
      return;
    }
    _RetValue = (Aig_Obj_t *)Vec_PtrEntry(pPStack_10->pAig->vCos,local_34);
    if (((pPStack_10->vCexes == (Vec_Ptr_t *)0x0) ||
        (pvVar2 = Vec_PtrEntry(pPStack_10->vCexes,local_34), pvVar2 == (void *)0x0)) &&
       ((pPStack_10->pPars->vOutMap == (Vec_Int_t *)0x0 ||
        (iVar1 = Vec_IntEntry(pPStack_10->pPars->vOutMap,local_34), iVar1 != -1)))) {
      iVar1 = Pdr_ObjSatVar(pPStack_10,pSat._4_4_,1,_RetValue);
      i = toLitCond(iVar1,1);
      iVar1 = sat_solver_addclause((sat_solver *)pObj,&i,&RetValue);
      if (iVar1 != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrSat.c"
                      ,0xc1,"void Pdr_ManSetPropertyOutput(Pdr_Man_t *, int)");
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void Pdr_ManSetPropertyOutput( Pdr_Man_t * p, int k )
{
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int Lit, RetValue, i;
    pSat = Pdr_ManSolver(p, k);
    Saig_ManForEachPo( p->pAig, pObj, i )
    {
        // skip solved outputs
        if ( p->vCexes && Vec_PtrEntry(p->vCexes, i) )
            continue;
        // skip timedout outputs
        if ( p->pPars->vOutMap && Vec_IntEntry(p->pPars->vOutMap, i) == -1 )
            continue;
        Lit = toLitCond( Pdr_ObjSatVar(p, k, 1, pObj), 1 ); // neg literal
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue == 1 );
    }
    sat_solver_compress( pSat );
}